

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

void __thiscall FIX::Initiator::stop(Initiator *this,bool force)

{
  bool bVar1;
  reference pSVar2;
  Session *pSVar3;
  SessionID *sessionID;
  reference ppSVar4;
  bool local_109;
  __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
  local_e0;
  __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
  local_d8;
  iterator session;
  Locker local_c0;
  Locker l_1;
  int second;
  Session *local_90;
  Session *pSession;
  _Self local_80;
  iterator i;
  Locker local_68;
  Locker l;
  SessionIDs connected;
  vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> enabledSessions;
  bool force_local;
  Initiator *this_local;
  
  bVar1 = isStopped(this);
  if (!bVar1) {
    HttpServer::stopGlobal();
    std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::vector
              ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
               &connected._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&l
              );
    Locker::Locker(&local_68,&this->m_mutex);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::operator=
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&l
               ,&this->m_connected);
    Locker::~Locker(&local_68);
    local_80._M_node =
         (_Base_ptr)
         std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::begin
                   ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                     *)&l);
    while( true ) {
      pSession = (Session *)
                 std::
                 set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
                 end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                      *)&l);
      bVar1 = std::operator!=(&local_80,(_Self *)&pSession);
      if (!bVar1) break;
      pSVar2 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_80);
      local_90 = Session::lookupSession(pSVar2);
      if ((local_90 != (Session *)0x0) && (bVar1 = Session::isEnabled(local_90), bVar1)) {
        std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::push_back
                  ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
                   &connected._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_90);
        pSVar3 = local_90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&second,"",(allocator<char> *)((long)&l_1.m_mutex + 7));
        Session::logout(pSVar3,(string *)&second);
        std::__cxx11::string::~string((string *)&second);
        std::allocator<char>::~allocator((allocator<char> *)((long)&l_1.m_mutex + 7));
      }
      std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_80);
    }
    if (!force) {
      l_1.m_mutex._0_4_ = 1;
      while( true ) {
        local_109 = false;
        if ((int)l_1.m_mutex < 0xb) {
          local_109 = isLoggedOn(this);
        }
        if (local_109 == false) break;
        process_sleep(1.0);
        l_1.m_mutex._0_4_ = (int)l_1.m_mutex + 1;
      }
    }
    Locker::Locker(&local_c0,&this->m_mutex);
    local_80._M_node =
         (_Base_ptr)
         std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::begin
                   ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                     *)&l);
    while( true ) {
      session._M_current =
           (Session **)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                     ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                       *)&l);
      bVar1 = std::operator!=(&local_80,(_Self *)&session);
      if (!bVar1) break;
      pSVar2 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_80);
      pSVar3 = Session::lookupSession(pSVar2);
      sessionID = Session::getSessionID(pSVar3);
      setDisconnected(this,sessionID);
      std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_80);
    }
    Locker::~Locker(&local_c0);
    this->m_stop = true;
    (*this->_vptr_Initiator[6])();
    if (this->m_threadid != 0) {
      thread_join(this->m_threadid);
    }
    this->m_threadid = 0;
    local_d8._M_current =
         (Session **)
         std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::begin
                   ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
                    &connected._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      local_e0._M_current =
           (Session **)
           std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::end
                     ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
                      &connected._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = __gnu_cxx::operator!=(&local_d8,&local_e0);
      if (!bVar1) break;
      ppSVar4 = __gnu_cxx::
                __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
                ::operator*(&local_d8);
      Session::logon(*ppSVar4);
      __gnu_cxx::
      __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
      ::operator++(&local_d8);
    }
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&l
              );
    std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::~vector
              ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
               &connected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void Initiator::stop( bool force )
{
  if( isStopped() ) return;

  HttpServer::stopGlobal();

  std::vector<Session*> enabledSessions;

  SessionIDs connected;

  {
    Locker l(m_mutex);
    connected = m_connected;
  }

  SessionIDs::iterator i = connected.begin();
  for ( ; i != connected.end(); ++i )
  {
    Session* pSession = Session::lookupSession(*i);
    if( pSession && pSession->isEnabled() )
    {
      enabledSessions.push_back( pSession );
      pSession->logout();
    }
  }

  if( !force )
  {
    for ( int second = 1; second <= 10 && isLoggedOn(); ++second )
      process_sleep( 1 );
  }

  {
    Locker l(m_mutex);
    for ( i = connected.begin(); i != connected.end(); ++i )
      setDisconnected( Session::lookupSession(*i)->getSessionID() );
  }

  m_stop = true;
  onStop();
  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;

  std::vector<Session*>::iterator session = enabledSessions.begin();
  for( ; session != enabledSessions.end(); ++session )
    (*session)->logon();
}